

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauTree.c
# Opt level: O2

int Dss_ManOperation(Dss_Man_t *p,int Type,int *pLits,int nLits,uchar *pPerm,word *pTruth)

{
  Vec_Ptr_t *p_00;
  Vec_Int_t *vFaninLits;
  uint uVar1;
  int iVar2;
  Dss_Obj_t *pDVar3;
  long lVar4;
  Dss_Obj_t *pDVar5;
  Dss_Obj_t *pDVar6;
  byte bVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  uchar *puVar13;
  uint uVar14;
  ulong uVar15;
  ulong local_f0;
  Dss_Obj_t *pChildren [12];
  int pBegEnd [12];
  
  if (pPerm != (uchar *)0x0 && Type != 3) {
    __assert_fail("Type == DAU_DSD_AND || pPerm == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauTree.c"
                  ,0x50d,
                  "int Dss_ManOperation(Dss_Man_t *, int, int *, int, unsigned char *, word *)");
  }
  if (pPerm == (uchar *)0x0 || Type != 3) {
    if (Type == 3) {
      uVar12 = 0;
      uVar15 = (ulong)(uint)nLits;
      if (nLits < 1) {
        uVar15 = uVar12;
      }
      local_f0 = 0;
      while( true ) {
        iVar9 = (int)local_f0;
        if (uVar12 == uVar15) break;
        pDVar3 = Dss_Lit2Obj(p->vObjs,pLits[uVar12]);
        if ((((ulong)pDVar3 & 1) == 0) && (uVar14 = *(uint *)&pDVar3->field_0x4, (uVar14 & 7) == 3))
        {
          for (lVar4 = 0; uVar8 = (uint)lVar4, uVar8 < uVar14 >> 0x1b; lVar4 = lVar4 + 1) {
            pDVar5 = Dss_ObjChild(p->vObjs,pDVar3,uVar8);
            if (pDVar5 == (Dss_Obj_t *)0x0) break;
            pChildren[iVar9 + lVar4] = pDVar5;
            uVar14 = *(uint *)&pDVar3->field_0x4;
          }
          uVar8 = iVar9 + uVar8;
        }
        else {
          uVar8 = iVar9 + 1;
          pChildren[iVar9] = pDVar3;
        }
        local_f0 = (ulong)uVar8;
        uVar12 = uVar12 + 1;
      }
      uVar14 = 0;
      Dss_ObjSort(p->vObjs,pChildren,iVar9,(int *)0x0);
    }
    else if (Type == 4) {
      uVar12 = 0;
      uVar15 = (ulong)(uint)nLits;
      if (nLits < 1) {
        uVar15 = uVar12;
      }
      local_f0 = 0;
      uVar14 = 0;
      for (; iVar9 = (int)local_f0, uVar12 != uVar15; uVar12 = uVar12 + 1) {
        uVar1 = Abc_LitIsCompl(pLits[uVar12]);
        p_00 = p->vObjs;
        iVar2 = Abc_LitRegular(pLits[uVar12]);
        pDVar3 = Dss_Lit2Obj(p_00,iVar2);
        uVar8 = *(uint *)&pDVar3->field_0x4;
        if ((uVar8 & 7) == 4) {
          for (lVar4 = 0; uVar10 = (uint)lVar4, uVar10 < uVar8 >> 0x1b; lVar4 = lVar4 + 1) {
            pDVar5 = Dss_ObjChild(p->vObjs,pDVar3,uVar10);
            if (pDVar5 == (Dss_Obj_t *)0x0) break;
            if (((ulong)pDVar5 & 1) != 0) {
              __assert_fail("!Dss_IsComplement(pChild)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauTree.c"
                            ,0x548,
                            "int Dss_ManOperation(Dss_Man_t *, int, int *, int, unsigned char *, word *)"
                           );
            }
            pChildren[iVar9 + lVar4] = pDVar5;
            uVar8 = *(uint *)&pDVar3->field_0x4;
          }
          uVar10 = iVar9 + uVar10;
        }
        else {
          uVar10 = iVar9 + 1;
          pChildren[iVar9] = pDVar3;
        }
        local_f0 = (ulong)uVar10;
        uVar14 = uVar14 ^ uVar1;
      }
      Dss_ObjSort(p->vObjs,pChildren,iVar9,(int *)0x0);
    }
    else if (Type == 5) {
      iVar9 = Abc_LitIsCompl(*pLits);
      if (iVar9 == 0) {
        iVar9 = pLits[1];
      }
      else {
        iVar9 = Abc_LitNot(*pLits);
        *pLits = iVar9;
        iVar2 = pLits[1];
        iVar9 = pLits[2];
        pLits[1] = iVar9;
        pLits[2] = iVar2;
      }
      iVar9 = Abc_LitIsCompl(iVar9);
      uVar15 = 0;
      if (iVar9 != 0) {
        iVar2 = Abc_LitNot(pLits[1]);
        pLits[1] = iVar2;
        iVar2 = Abc_LitNot(pLits[2]);
        pLits[2] = iVar2;
      }
      uVar14 = (uint)(iVar9 != 0);
      local_f0 = (ulong)(uint)nLits;
      if (nLits < 1) {
        local_f0 = uVar15;
      }
      for (; local_f0 != uVar15; uVar15 = uVar15 + 1) {
        pDVar3 = Dss_Lit2Obj(p->vObjs,pLits[uVar15]);
        pChildren[uVar15] = pDVar3;
      }
    }
    else {
      if (Type != 6) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauTree.c"
                      ,0x563,
                      "int Dss_ManOperation(Dss_Man_t *, int, int *, int, unsigned char *, word *)")
        ;
      }
      uVar14 = 0;
      local_f0 = (ulong)(uint)nLits;
      if (nLits < 1) {
        local_f0 = 0;
      }
      for (uVar15 = 0; local_f0 != uVar15; uVar15 = uVar15 + 1) {
        pDVar3 = Dss_Lit2Obj(p->vObjs,pLits[uVar15]);
        pChildren[uVar15] = pDVar3;
      }
    }
  }
  else {
    uVar12 = 0;
    uVar15 = (ulong)(uint)nLits;
    if (nLits < 1) {
      uVar15 = uVar12;
    }
    local_f0 = 0;
    uVar14 = 0;
    for (; uVar12 != uVar15; uVar12 = uVar12 + 1) {
      pDVar3 = Dss_Lit2Obj(p->vObjs,pLits[uVar12]);
      lVar4 = (long)(int)local_f0;
      if ((((ulong)pDVar3 & 1) == 0) && (uVar8 = *(uint *)&pDVar3->field_0x4, (uVar8 & 7) == 3)) {
        for (lVar11 = 0; uVar1 = (uint)lVar11, uVar1 < uVar8 >> 0x1b; lVar11 = lVar11 + 1) {
          pDVar5 = Dss_ObjChild(p->vObjs,pDVar3,uVar1);
          if (pDVar5 == (Dss_Obj_t *)0x0) break;
          bVar7 = (*(uint *)&((Dss_Obj_t *)((ulong)pDVar5 & 0xfffffffffffffffe))->field_0x4 & 7) ==
                  2 & (byte)pDVar5;
          pDVar6 = (Dss_Obj_t *)((ulong)pDVar5 & 0xfffffffffffffffe);
          if (bVar7 == 0) {
            pDVar6 = pDVar5;
          }
          uVar8 = uVar14 << 0x10;
          uVar14 = uVar14 + (*(uint *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4) >> 3 & 0xff);
          pBegEnd[lVar4 + lVar11] = uVar8 | (uint)bVar7 << 8 | uVar14;
          pChildren[lVar4 + lVar11] = pDVar6;
          uVar8 = *(uint *)&pDVar3->field_0x4;
        }
        uVar1 = (int)local_f0 + uVar1;
      }
      else {
        bVar7 = (*(uint *)&((Dss_Obj_t *)((ulong)pDVar3 & 0xfffffffffffffffe))->field_0x4 & 7) == 2
                & (byte)pDVar3;
        pDVar5 = (Dss_Obj_t *)((ulong)pDVar3 & 0xfffffffffffffffe);
        if (bVar7 == 0) {
          pDVar5 = pDVar3;
        }
        uVar8 = uVar14 << 0x10;
        uVar14 = uVar14 + (*(uint *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4) >> 3 & 0xff);
        pBegEnd[lVar4] = uVar8 | (uint)bVar7 << 8 | uVar14;
        uVar1 = (int)local_f0 + 1;
        pChildren[lVar4] = pDVar5;
      }
      local_f0 = (ulong)uVar1;
    }
    Dss_ObjSort(p->vObjs,pChildren,(int)local_f0,pBegEnd);
    uVar12 = 0;
    uVar15 = 0;
    if (0 < (int)local_f0) {
      uVar15 = local_f0;
    }
    uVar8 = 0;
    for (; uVar12 != uVar15; uVar12 = uVar12 + 1) {
      uVar1 = pBegEnd[uVar12];
      puVar13 = pPerm + (int)uVar8;
      for (iVar9 = (int)uVar1 >> 0x10; iVar9 < (int)(uVar1 & 0xff); iVar9 = iVar9 + 1) {
        iVar2 = Abc_Var2Lit(iVar9,uVar1 >> 8 & 1);
        *puVar13 = (uchar)iVar2;
        uVar1 = pBegEnd[uVar12];
        uVar8 = uVar8 + 1;
        puVar13 = puVar13 + 1;
      }
    }
    if (uVar8 != uVar14) {
      __assert_fail("j == nSSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauTree.c"
                    ,0x52e,
                    "int Dss_ManOperation(Dss_Man_t *, int, int *, int, unsigned char *, word *)");
    }
    uVar14 = 0;
  }
  p->vLeaves->nSize = 0;
  uVar15 = 0;
  if ((int)local_f0 < 1) {
    local_f0 = uVar15;
  }
  for (; vFaninLits = p->vLeaves, local_f0 != uVar15; uVar15 = uVar15 + 1) {
    iVar9 = Dss_Obj2Lit(pChildren[uVar15]);
    Vec_IntPush(vFaninLits,iVar9);
  }
  pDVar3 = Dss_ObjFindOrAdd(p,Type,vFaninLits,pTruth);
  iVar9 = Abc_Var2Lit(pDVar3->Id,uVar14);
  return iVar9;
}

Assistant:

int Dss_ManOperation( Dss_Man_t * p, int Type, int * pLits, int nLits, unsigned char * pPerm, word * pTruth )
{
    Dss_Obj_t * pChildren[DAU_MAX_VAR];
    Dss_Obj_t * pObj, * pChild;
    int i, k, nChildren = 0, fCompl = 0, fComplFan;

    assert( Type == DAU_DSD_AND || pPerm == NULL );
    if ( Type == DAU_DSD_AND && pPerm != NULL )
    {
        int pBegEnd[DAU_MAX_VAR];
        int j, nSSize = 0;
        for ( k = 0; k < nLits; k++ )
        {
            pObj = Dss_Lit2Obj(p->vObjs, pLits[k]);
            if ( Dss_IsComplement(pObj) || pObj->Type != DAU_DSD_AND )
            {
                fComplFan = (Dss_Regular(pObj)->Type == DAU_DSD_VAR && Dss_IsComplement(pObj));
                if ( fComplFan )
                    pObj = Dss_Regular(pObj);
                pBegEnd[nChildren] = (nSSize << 16) | (fComplFan << 8) | (nSSize + Dss_Regular(pObj)->nSupp);
                nSSize += Dss_Regular(pObj)->nSupp;
                pChildren[nChildren++] = pObj;
            }
            else
                Dss_ObjForEachChild( p->vObjs, pObj, pChild, i )
                {
                    fComplFan = (Dss_Regular(pChild)->Type == DAU_DSD_VAR && Dss_IsComplement(pChild));
                    if ( fComplFan )
                        pChild = Dss_Regular(pChild);
                    pBegEnd[nChildren] = (nSSize << 16) | (fComplFan << 8) | (nSSize + Dss_Regular(pChild)->nSupp);
                    nSSize += Dss_Regular(pChild)->nSupp;
                    pChildren[nChildren++] = pChild;
                }
        }
        Dss_ObjSort( p->vObjs, pChildren, nChildren, pBegEnd );
        // create permutation
        for ( j = i = 0; i < nChildren; i++ )
            for ( k = (pBegEnd[i] >> 16); k < (pBegEnd[i] & 0xFF); k++ )
                pPerm[j++] = (unsigned char)Abc_Var2Lit( k, (pBegEnd[i] >> 8) & 1 );
        assert( j == nSSize );
    }
    else if ( Type == DAU_DSD_AND )
    {
        for ( k = 0; k < nLits; k++ )
        {
            pObj = Dss_Lit2Obj(p->vObjs, pLits[k]);
            if ( Dss_IsComplement(pObj) || pObj->Type != DAU_DSD_AND )
                pChildren[nChildren++] = pObj;
            else
                Dss_ObjForEachChild( p->vObjs, pObj, pChild, i )
                    pChildren[nChildren++] = pChild;
        }
        Dss_ObjSort( p->vObjs, pChildren, nChildren, NULL );
    }
    else if ( Type == DAU_DSD_XOR )
    {
        for ( k = 0; k < nLits; k++ )
        {
            fCompl ^= Abc_LitIsCompl(pLits[k]);
            pObj = Dss_Lit2Obj(p->vObjs, Abc_LitRegular(pLits[k]));
            if ( pObj->Type != DAU_DSD_XOR )
                pChildren[nChildren++] = pObj;
            else
                Dss_ObjForEachChild( p->vObjs, pObj, pChild, i )
                {
                    assert( !Dss_IsComplement(pChild) );
                    pChildren[nChildren++] = pChild;
                }
        }
        Dss_ObjSort( p->vObjs, pChildren, nChildren, NULL );
    }
    else if ( Type == DAU_DSD_MUX )
    {
        if ( Abc_LitIsCompl(pLits[0]) )
        {
            pLits[0] = Abc_LitNot(pLits[0]);
            ABC_SWAP( int, pLits[1], pLits[2] );
        }
        if ( Abc_LitIsCompl(pLits[1]) )
        {
            pLits[1] = Abc_LitNot(pLits[1]);
            pLits[2] = Abc_LitNot(pLits[2]);
            fCompl ^= 1;
        }
        for ( k = 0; k < nLits; k++ )
            pChildren[nChildren++] = Dss_Lit2Obj(p->vObjs, pLits[k]);
    }
    else if ( Type == DAU_DSD_PRIME )
    {
        for ( k = 0; k < nLits; k++ )
            pChildren[nChildren++] = Dss_Lit2Obj(p->vObjs, pLits[k]);
    }
    else assert( 0 );

    // shift subgraphs
    Vec_IntClear( p->vLeaves );
    for ( i = 0; i < nChildren; i++ )
        Vec_IntPush( p->vLeaves, Dss_Obj2Lit(pChildren[i]) );
    // create new graph
    pObj = Dss_ObjFindOrAdd( p, Type, p->vLeaves, pTruth );
    return Abc_Var2Lit( pObj->Id, fCompl );
}